

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void laguerre_polynomial_values(int *n_data,int *n,double *x,double *fx)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = *n_data;
  if ((int)uVar2 < 0) {
    *n_data = 0;
    uVar2 = 0;
  }
  else if (0x10 < uVar2) {
    *n_data = 0;
    *n = 0;
    *x = 0.0;
    *fx = 0.0;
    return;
  }
  *n = (&DAT_002278a0)[uVar2];
  iVar1 = *n_data;
  *x = *(double *)(&DAT_002278f0 + (long)iVar1 * 8);
  *fx = *(double *)(&DAT_00227810 + (long)iVar1 * 8);
  *n_data = iVar1 + 1;
  return;
}

Assistant:

void laguerre_polynomial_values ( int *n_data, int *n, double *x, double *fx )

//****************************************************************************80
//
//  Purpose:
//
//    LAGUERRE_POLYNOMIAL_VALUES returns some values of the Laguerre polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    03 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and N_DATA
//    is set to 1.  On each subsequent call, the input value of N_DATA is
//    incremented and that test data item is returned, if available.  When
//    there is no more test data, N_DATA is set to 0.
//
//    Output, int *N, the order of the polynomial.
//
//    Output, double *X, the point where the polynomial is evaluated.
//
//    Output, double *FX, the value of the function.
//
{
# define N_MAX 17

  double fx_vec[N_MAX] = {
     1.0000000000,  0.0000000000, -0.5000000000, 
    -0.6666666667, -0.6250000000, -0.4666666667, 
    -0.2569444444, -0.0404761905,  0.1539930556, 
     0.3097442681,  0.4189459325,  0.4801341791, 
     0.4962122235, -0.4455729167,  0.8500000000, 
    -3.1666666667, 34.3333333333 };
  int n_vec[N_MAX] = {
     0,  1,  2, 
     3,  4,  5, 
     6,  7,  8, 
     9, 10, 11, 
    12,  5,  5, 
     5,  5 };
  double x_vec[N_MAX] = {
    1.0,  1.0,  1.0, 
    1.0,  1.0,  1.0, 
    1.0,  1.0,  1.0, 
    1.0,  1.0,  1.0, 
    1.0,  0.5,  3.0, 
    5.0, 10.0 };

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *n = 0;
    *x = 0.0;
    *fx = 0.0;
  }
  else
  {
    *n = n_vec[*n_data];
    *x = x_vec[*n_data];
    *fx = fx_vec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}